

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O2

shared_ptr<std::pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>_>
chaiscript::dispatch::detail::
call_func<chaiscript::dispatch::detail::Constructor<std::pair<chaiscript::Boxed_Value,chaiscript::Boxed_Value>,chaiscript::Boxed_Value_const&,chaiscript::Boxed_Value_const&>,std::shared_ptr<std::pair<chaiscript::Boxed_Value,chaiscript::Boxed_Value>>,chaiscript::Boxed_Value_const&,chaiscript::Boxed_Value_const&,0ul,1ul>
          (element_type *param_1,undefined8 param_2,undefined8 param_3,long *param_4,
          Type_Conversions_State *param_5)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<std::pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>_> sVar1;
  chaiscript acStack_38 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  Boxed_Value local_28;
  
  boxed_cast<chaiscript::Boxed_Value_const&>
            ((chaiscript *)&local_28,(Boxed_Value *)*param_4,param_5);
  boxed_cast<chaiscript::Boxed_Value_const&>(acStack_38,(Boxed_Value *)(*param_4 + 0x10),param_5);
  std::
  make_shared<std::pair<chaiscript::Boxed_Value,chaiscript::Boxed_Value>,chaiscript::Boxed_Value,chaiscript::Boxed_Value>
            (&param_1->first,&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  sVar1.
  super___shared_ptr<std::pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.
  super___shared_ptr<std::pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = param_1;
  return (shared_ptr<std::pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>_>)
         sVar1.
         super___shared_ptr<std::pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

Ret call_func(const chaiscript::dispatch::detail::Function_Signature<Ret (Params...)> &, Indexes<I...>, const Callable &f,
            const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions)
        {
          (void)params; (void)t_conversions;
          return f(boxed_cast<Params>(params[I], &t_conversions)...);
        }